

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variation.cpp
# Opt level: O3

void __thiscall Variation::canonify(Variation *this,NamedDnaSequence *reference,bool rightmost)

{
  string *this_00;
  undefined8 *puVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  undefined8 *puVar5;
  runtime_error *this_01;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  iVar4 = *(int *)(this + 0x60);
  if (iVar4 == 0) {
    return;
  }
  if (iVar4 == 2) {
    if (rightmost) {
      if (*(ulong *)(this + 0x30) < reference->length) {
        sVar6 = *(size_t *)(this + 0x28);
        do {
          cVar2 = NamedDnaSequence::operator[](reference,sVar6);
          cVar3 = NamedDnaSequence::operator[](reference,*(size_t *)(this + 0x30));
          if (cVar2 != cVar3) break;
          lVar9 = *(long *)(this + 0x30);
          sVar6 = *(long *)(this + 0x28) + 1;
          *(size_t *)(this + 0x28) = sVar6;
          *(ulong *)(this + 0x30) = lVar9 + 1U;
        } while (lVar9 + 1U < reference->length);
      }
    }
    else {
      lVar9 = *(long *)(this + 0x28);
      while (lVar9 != 0) {
        cVar2 = NamedDnaSequence::operator[](reference,lVar9 - 1);
        cVar3 = NamedDnaSequence::operator[](reference,*(long *)(this + 0x30) - 1);
        if (cVar2 != cVar3) break;
        lVar9 = *(long *)(this + 0x28) + -1;
        *(long *)(this + 0x28) = lVar9;
        *(long *)(this + 0x30) = *(long *)(this + 0x30) + -1;
      }
    }
    iVar4 = *(int *)(this + 0x60);
  }
  if (iVar4 != 1) {
    return;
  }
  if (*(long *)(this + 0x48) == 0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_01,"Variation::canonify is only applicable to insertions if sequence is known");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = (string *)(this + 0x40);
  if (rightmost) {
    sVar6 = *(size_t *)(this + 0x28);
    if (sVar6 == reference->length) {
      return;
    }
    uVar7 = 0;
    do {
      cVar2 = *(char *)(*(long *)(this + 0x40) + uVar7 % *(ulong *)(this + 0x30));
      cVar3 = NamedDnaSequence::operator[](reference,sVar6);
      if (cVar2 != cVar3) {
        if (uVar7 == 0) {
          return;
        }
        break;
      }
      uVar7 = uVar7 + 1;
      sVar6 = *(long *)(this + 0x28) + uVar7;
    } while (sVar6 != reference->length);
    *(ulong *)(this + 0x28) = *(long *)(this + 0x28) + uVar7;
    if (uVar7 % *(ulong *)(this + 0x30) == 0) {
      return;
    }
    std::__cxx11::string::substr((ulong)&local_50,(ulong)this_00);
    std::__cxx11::string::substr((ulong)&local_70,(ulong)this_00);
    uVar7 = 0xf;
    if (local_50 != local_40) {
      uVar7 = local_40[0];
    }
    if (uVar7 < (ulong)(local_68 + local_48)) {
      uVar7 = 0xf;
      if (local_70 != local_60) {
        uVar7 = local_60[0];
      }
      if ((ulong)(local_68 + local_48) <= uVar7) {
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_50);
        goto LAB_0017c339;
      }
    }
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70);
  }
  else {
    uVar7 = *(ulong *)(this + 0x28);
    if (uVar7 == 0) {
      return;
    }
    lVar9 = -1;
    uVar8 = 0;
    do {
      cVar2 = *(char *)(~(uVar8 % *(ulong *)(this + 0x30)) +
                       *(ulong *)(this + 0x30) + *(long *)(this + 0x40));
      cVar3 = NamedDnaSequence::operator[](reference,uVar7 + lVar9);
      if (cVar2 != cVar3) {
        if (uVar8 == 0) {
          return;
        }
        break;
      }
      uVar8 = uVar8 + 1;
      uVar7 = *(ulong *)(this + 0x28);
      lVar9 = lVar9 + -1;
    } while (uVar8 != uVar7);
    *(ulong *)(this + 0x28) = *(long *)(this + 0x28) - uVar8;
    if (uVar8 % *(ulong *)(this + 0x30) == 0) {
      return;
    }
    std::__cxx11::string::substr((ulong)&local_50,(ulong)this_00);
    std::__cxx11::string::substr((ulong)&local_70,(ulong)this_00);
    uVar7 = 0xf;
    if (local_50 != local_40) {
      uVar7 = local_40[0];
    }
    if (uVar7 < (ulong)(local_68 + local_48)) {
      uVar7 = 0xf;
      if (local_70 != local_60) {
        uVar7 = local_60[0];
      }
      if ((ulong)(local_68 + local_48) <= uVar7) {
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_50);
        goto LAB_0017c339;
      }
    }
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70);
  }
LAB_0017c339:
  local_90 = &local_80;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_80 = *puVar1;
    uStack_78 = puVar5[3];
  }
  else {
    local_80 = *puVar1;
    local_90 = (undefined8 *)*puVar5;
  }
  local_88 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  std::__cxx11::string::operator=(this_00,(string *)&local_90);
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return;
}

Assistant:

void Variation::canonify(const NamedDnaSequence* reference, bool rightmost) {
	if (type == NONE) return;
	if (type == DELETION) {
		assert(coord1 < coord2);
		assert(coord2 <= reference->size());
		if (rightmost) {
			while (coord2 < reference->size()) {
				if ((*reference)[coord1] != (*reference)[coord2]) break;
				coord1 += 1;
				coord2 += 1;
			}
		} else {
			while (coord1 > 0) {
				if ((*reference)[coord1-1] != (*reference)[coord2-1]) break;
				coord1 -= 1;
				coord2 -= 1;
			}
		}
	}
	if (type == INSERTION) {
		if (sequence.size() == 0) throw runtime_error("Variation::canonify is only applicable to insertions if sequence is known");
		assert(coord1 <= reference->size());
		assert(sequence.size() == coord2);
		if (rightmost) {
			// number of positions by which insertion can be shifted to the right
			int shift = 0;
			while (true) {
				if (coord1 + shift == reference->size()) break;
				if (sequence[shift % coord2] != (*reference)[coord1 + shift]) break;
				shift += 1;
			}
			if (shift == 0) return;
			coord1 += shift;
			// rotate insertion sequence by shift%insertion_length characters
			int j = shift % coord2;
			if (j == 0) return;
			sequence = sequence.substr(j, sequence.size()-j) + sequence.substr(0, j);
		} else {
			// number of positions by which insertion can be shifted to the left
			int shift = 0;
			while (true) {
				if (coord1 - shift == 0) break;
				if (sequence[coord2 - 1 - (shift % coord2)] != (*reference)[coord1 - shift - 1]) break;
				shift += 1;
			}
			if (shift == 0) return;
			coord1 -= shift;
			// rotate insertion sequence by shift%insertion_length characters
			int j = shift % coord2;
			if (j == 0) return;
			sequence = sequence.substr(sequence.size()-j, j) + sequence.substr(0, sequence.size()-j);
		}
	}
}